

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O1

uint32_t __thiscall
duckdb::FixedSizeBuffer::GetOffset
          (FixedSizeBuffer *this,idx_t bitmask_count,idx_t available_segments)

{
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  TemplatedValidityData<unsigned_long> *pTVar3;
  InternalException *this_00;
  ulong uVar4;
  unsigned_long uVar5;
  long lVar6;
  long lVar7;
  uint32_t uVar8;
  bool bVar9;
  string local_78;
  _Head_base<0UL,_unsigned_long_*,_false> local_58;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_50;
  idx_t local_40;
  idx_t local_38;
  
  local_58._M_head_impl = (unsigned_long *)Get(this,true);
  local_50.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_50.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar4 = this->segment_count;
  local_40 = available_segments;
  if (local_58._M_head_impl == (unsigned_long *)0x0) {
LAB_00f54735:
    local_38 = available_segments;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_78,&local_38);
    _Var2._M_pi = local_50.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_50.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
    local_50.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
    }
    pTVar3 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&local_50);
    local_58._M_head_impl =
         (pTVar3->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  else {
    if ((local_58._M_head_impl[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      bVar9 = bitmask_count != 0;
      if (bVar9) {
        uVar5 = *local_58._M_head_impl;
        if (uVar5 == 0) {
          this = (FixedSizeBuffer *)0x0;
          uVar4 = 0;
          do {
            if (bitmask_count - 1 == uVar4) {
              bVar9 = false;
              goto LAB_00f54896;
            }
            uVar5 = (local_58._M_head_impl + 1)[uVar4];
            this = (FixedSizeBuffer *)&(this->buffer_handle).node;
            uVar4 = uVar4 + 1;
          } while (uVar5 == 0);
          bVar9 = uVar4 < bitmask_count;
        }
        else {
          this = (FixedSizeBuffer *)0x0;
        }
        lVar6 = 0;
        lVar7 = 0;
        do {
          uVar4 = (&BASE)[lVar6] & uVar5;
          if (uVar4 == 0) {
            uVar4 = uVar5 >> (*(byte *)((long)&SHIFT + lVar6) & 0x3f);
            lVar7 = lVar7 + (ulong)*(byte *)((long)&SHIFT + lVar6);
          }
          lVar6 = lVar6 + 1;
          uVar5 = uVar4;
        } while (lVar6 != 6);
        if (local_58._M_head_impl == (unsigned_long *)0x0) {
          local_38 = available_segments;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          _Var2._M_pi = local_50.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_50.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
          local_50.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_78._M_dataplus._M_p;
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_78._M_string_length = 0;
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
          }
          pTVar3 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&local_50);
          local_58._M_head_impl =
               (pTVar3->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar1 = (byte)lVar7 & 0x3f;
        this = (FixedSizeBuffer *)
               ((long)&((optional_ptr<duckdb::FileBuffer,_true> *)this)->ptr + lVar7);
        local_58._M_head_impl[(ulong)this >> 6] =
             local_58._M_head_impl[(ulong)this >> 6] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      }
LAB_00f54896:
      uVar8 = (uint32_t)this;
      if (!bVar9) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Invalid bitmask for FixedSizeAllocator","");
        InternalException::InternalException(this_00,&local_78);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_00f5489b;
    }
    if (local_58._M_head_impl == (unsigned_long *)0x0) goto LAB_00f54735;
  }
  bVar1 = (byte)uVar4 & 0x3f;
  local_58._M_head_impl[uVar4 >> 6] =
       local_58._M_head_impl[uVar4 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
  uVar8 = (uint32_t)this->segment_count;
LAB_00f5489b:
  if (local_50.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return uVar8;
}

Assistant:

uint32_t FixedSizeBuffer::GetOffset(const idx_t bitmask_count, const idx_t available_segments) {

	// get the bitmask data
	auto bitmask_ptr = reinterpret_cast<validity_t *>(Get());
	ValidityMask mask(bitmask_ptr, available_segments);
	auto data = mask.GetData();

	// fills up a buffer sequentially before searching for free bits
	if (mask.RowIsValid(segment_count)) {
		mask.SetInvalid(segment_count);
		return UnsafeNumericCast<uint32_t>(segment_count);
	}

	for (idx_t entry_idx = 0; entry_idx < bitmask_count; entry_idx++) {
		// get an entry with free bits
		if (data[entry_idx] == 0) {
			continue;
		}

		// find the position of the free bit
		auto entry = data[entry_idx];
		idx_t first_valid_bit = 0;

		// this loop finds the position of the rightmost set bit in entry and stores it
		// in first_valid_bit
		for (idx_t i = 0; i < 6; i++) {
			// set the left half of the bits of this level to zero and test if the entry is still not zero
			if (entry & BASE[i]) {
				// first valid bit is in the rightmost s[i] bits
				// permanently set the left half of the bits to zero
				entry &= BASE[i];
			} else {
				// first valid bit is in the leftmost s[i] bits
				// shift by s[i] for the next iteration and add s[i] to the position of the rightmost set bit
				entry >>= SHIFT[i];
				first_valid_bit += SHIFT[i];
			}
		}
		D_ASSERT(entry);

		auto prev_bits = entry_idx * sizeof(validity_t) * 8;
		D_ASSERT(mask.RowIsValid(prev_bits + first_valid_bit));
		mask.SetInvalid(prev_bits + first_valid_bit);
		return UnsafeNumericCast<uint32_t>(prev_bits + first_valid_bit);
	}

	throw InternalException("Invalid bitmask for FixedSizeAllocator");
}